

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

void LowererMD::ChangeToIMul(Instr *instr,bool hasOverflowCheck)

{
  code *pcVar1;
  bool bVar2;
  RegNum reg;
  RegOpnd *this;
  Opnd *pOVar3;
  Instr *pIVar4;
  AddrOpnd *pAVar5;
  undefined4 *puVar6;
  undefined8 uVar7;
  int64 value;
  IntConstOpnd *pIVar8;
  byte local_59;
  Opnd *dst;
  bool dontEncode;
  Opnd *src2;
  Opnd *temp2;
  RegOpnd *regEAX;
  bool hasOverflowCheck_local;
  Instr *instr_local;
  
  if (((!hasOverflowCheck) || (bVar2 = IR::Instr::ShouldCheckFor32BitOverflow(instr), bVar2)) ||
     (bVar2 = IR::Instr::ShouldCheckForNon32BitOverflow(instr), !bVar2)) {
    EmitInt4Instr(instr);
  }
  else {
    this = IR::RegOpnd::New(TyInt32,instr->m_func);
    src2 = (Opnd *)0x0;
    reg = LowererMDArch::GetRegIMulDestLower();
    IR::RegOpnd::SetReg(this,reg);
    pOVar3 = IR::Instr::GetSrc1(instr);
    pIVar4 = IR::Instr::New(MOV,&this->super_Opnd,pOVar3,instr->m_func);
    IR::Instr::InsertBefore(instr,pIVar4);
    pOVar3 = IR::Instr::GetSrc2(instr);
    bVar2 = IR::Opnd::IsImmediateOpnd(pOVar3);
    if (bVar2) {
      src2 = &IR::RegOpnd::New(TyInt32,instr->m_func)->super_Opnd;
      pOVar3 = IR::Instr::GetSrc2(instr);
      bVar2 = IR::Opnd::IsHelperCallOpnd(pOVar3);
      if (bVar2) {
        dst._7_1_ = true;
      }
      else {
        bVar2 = IR::Opnd::IsIntConstOpnd(pOVar3);
        if ((bVar2) || (bVar2 = IR::Opnd::IsAddrOpnd(pOVar3), bVar2)) {
          bVar2 = IR::Opnd::IsIntConstOpnd(pOVar3);
          if (bVar2) {
            pIVar8 = IR::Opnd::AsIntConstOpnd(pOVar3);
            local_59 = pIVar8->m_dontEncode;
          }
          else {
            pAVar5 = IR::Opnd::AsAddrOpnd(pOVar3);
            local_59 = pAVar5->field_0x28 & 1;
          }
          dst._7_1_ = (bool)(local_59 & 1);
        }
        else {
          bVar2 = IR::Opnd::IsInt64ConstOpnd(pOVar3);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                               ,0x55c,"(false)","Unexpected immediate opnd");
            if (bVar2) {
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 0;
              uVar7 = __cxa_allocate_exception(1);
              __cxa_throw(uVar7,&Js::OperationAbortedException::typeinfo,0);
            }
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          dst._7_1_ = false;
        }
      }
      pOVar3 = IR::Instr::GetSrc2(instr);
      value = IR::Opnd::GetImmediateValue(pOVar3,instr->m_func);
      pIVar8 = IR::IntConstOpnd::New(value,TyInt32,instr->m_func,dst._7_1_);
      pIVar4 = IR::Instr::New(MOV,src2,&pIVar8->super_Opnd,instr->m_func);
      IR::Instr::InsertBefore(instr,pIVar4);
    }
    instr->m_opcode = IMUL;
    IR::Instr::ReplaceSrc1(instr,&this->super_Opnd);
    if (src2 != (Opnd *)0x0) {
      IR::Instr::ReplaceSrc2(instr,src2);
    }
    pOVar3 = IR::Instr::GetDst(instr);
    pOVar3 = IR::Opnd::Copy(pOVar3,instr->m_func);
    IR::Instr::ReplaceDst(instr,&this->super_Opnd);
    pIVar4 = IR::Instr::New(MOV,pOVar3,&this->super_Opnd,instr->m_func);
    IR::Instr::InsertAfter(instr,pIVar4);
  }
  return;
}

Assistant:

void LowererMD::ChangeToIMul(IR::Instr *const instr, bool hasOverflowCheck)
{
    // If non-32 bit overflow check is needed, we have to use the IMUL form.
    if (hasOverflowCheck && !instr->ShouldCheckFor32BitOverflow() && instr->ShouldCheckForNon32BitOverflow())
    {
        IR::RegOpnd *regEAX = IR::RegOpnd::New(TyInt32, instr->m_func);
        IR::Opnd *temp2 = nullptr;
        // MOV eax, src1
        regEAX->SetReg(LowererMDArch::GetRegIMulDestLower());
        instr->InsertBefore(IR::Instr::New(Js::OpCode::MOV, regEAX, instr->GetSrc1(), instr->m_func));

        if (instr->GetSrc2()->IsImmediateOpnd())
        {
            // MOV reg, imm
            temp2 = IR::RegOpnd::New(TyInt32, instr->m_func);

            IR::Opnd * src2 = instr->GetSrc2();
            bool dontEncode = false;
            if (src2->IsHelperCallOpnd())
            {
                dontEncode = true;
            }
            else if (src2->IsIntConstOpnd() || src2->IsAddrOpnd())
            {
                dontEncode = src2->IsIntConstOpnd() ? src2->AsIntConstOpnd()->m_dontEncode : src2->AsAddrOpnd()->m_dontEncode;
            }
            else if (src2->IsInt64ConstOpnd())
            {
                dontEncode = false;
            }
            else
            {
                AssertMsg(false, "Unexpected immediate opnd");
                throw Js::OperationAbortedException();
            }

            instr->InsertBefore(IR::Instr::New(Js::OpCode::MOV, temp2,
                IR::IntConstOpnd::New((IntConstType)instr->GetSrc2()->GetImmediateValue(instr->m_func), TyInt32, instr->m_func, dontEncode),
                instr->m_func));
        }
        // eax = IMUL eax, reg
        instr->m_opcode = Js::OpCode::IMUL;
        instr->ReplaceSrc1(regEAX);

        if (temp2 != nullptr)
            instr->ReplaceSrc2(temp2);

        auto *dst = instr->GetDst()->Copy(instr->m_func);
        instr->ReplaceDst(regEAX);

        // MOV dst, eax
        instr->InsertAfter(IR::Instr::New(Js::OpCode::MOV, dst, regEAX, instr->m_func));
    }
    else
        EmitInt4Instr(instr); // IMUL2
}